

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_Parser.h
# Opt level: O2

void __thiscall soul::heart::Parser::parseConnection(Parser *this)

{
  optional<unsigned_long> *poVar1;
  bool bVar2;
  int32_t iVar3;
  Module *pMVar4;
  Connection *pCVar5;
  InterpolationType IVar6;
  ProcessorAndChannel src;
  ProcessorAndChannel dst;
  
  pMVar4 = pool_ptr<soul::Module>::operator->(&this->module);
  pCVar5 = Module::allocate<soul::heart::Connection,soul::CodeLocation&>
                     (pMVar4,&(this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                              ).location);
  pMVar4 = pool_ptr<soul::Module>::operator->(&this->module);
  src.processor.object = (ProcessorInstance *)pCVar5;
  std::
  vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
  ::emplace_back<soul::pool_ref<soul::heart::Connection>>
            ((vector<soul::pool_ref<soul::heart::Connection>,std::allocator<soul::pool_ref<soul::heart::Connection>>>
              *)&pMVar4->connections,(pool_ref<soul::heart::Connection> *)&src);
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIfKeywordOrIdentifier
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,"none");
  IVar6 = none;
  if (!bVar2) {
    bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
            ::matchIfKeywordOrIdentifier
                      (&this->
                        super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                       ,"latch");
    if (bVar2) {
      IVar6 = latch;
    }
    else {
      bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
              ::matchIfKeywordOrIdentifier
                        (&this->
                          super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                         ,"linear");
      if (bVar2) {
        IVar6 = linear;
      }
      else {
        bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                ::matchIfKeywordOrIdentifier
                          (&this->
                            super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                           ,"sinc");
        if (bVar2) {
          IVar6 = sinc;
        }
        else {
          bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                  ::matchIfKeywordOrIdentifier
                            (&this->
                              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                             ,"fast");
          if (bVar2) {
            IVar6 = fast;
          }
          else {
            bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                    ::matchIfKeywordOrIdentifier
                              (&this->
                                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                               ,"best");
            if (bVar2) {
              IVar6 = best;
            }
            else {
              Errors::expectedInterpolationType<>();
              (*(this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                )._vptr_Tokeniser[2])(this,&src);
              CompileMessage::~CompileMessage((CompileMessage *)&src);
            }
          }
        }
      }
    }
  }
  pCVar5->interpolationType = IVar6;
  readProcessorAndChannel(&src,this);
  (pCVar5->source).processor.object = src.processor.object;
  std::__cxx11::string::_M_assign((string *)&(pCVar5->source).endpointName);
  (pCVar5->source).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       src.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  poVar1 = &(pCVar5->source).endpointIndex;
  (poVar1->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       src.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  *(undefined7 *)
   &(poVar1->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 =
       src.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._9_7_;
  Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
  expect<soul::TokenType>
            (&this->
              super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
             ,(TokenType)0x2a3701);
  bVar2 = Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
          ::matchIf<soul::TokenType>
                    (&this->
                      super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
                     ,(TokenType)0x2cada8);
  if (bVar2) {
    iVar3 = parseInt32(this);
    if ((pCVar5->delayLength).super__Optional_base<long,_true,_true>._M_payload.
        super__Optional_payload_base<long>._M_engaged == false) {
      (pCVar5->delayLength).super__Optional_base<long,_true,_true>._M_payload.
      super__Optional_payload_base<long>._M_engaged = true;
    }
    (pCVar5->delayLength).super__Optional_base<long,_true,_true>._M_payload.
    super__Optional_payload_base<long>._M_payload = (_Storage<long,_true>)(long)iVar3;
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a0190);
    Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>::
    expect<soul::TokenType>
              (&this->
                super_Tokeniser<soul::DummyKeywordMatcher,_soul::HEARTOperator::Matcher,_soul::IdentifierMatcher>
               ,(TokenType)0x2a3701);
  }
  readProcessorAndChannel(&dst,this);
  (pCVar5->dest).processor.object = dst.processor.object;
  std::__cxx11::string::_M_assign((string *)&(pCVar5->dest).endpointName);
  (pCVar5->dest).endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
  super__Optional_payload_base<unsigned_long>._M_payload =
       dst.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  poVar1 = &(pCVar5->dest).endpointIndex;
  (poVar1->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
  super__Optional_payload_base<unsigned_long>._M_engaged =
       dst.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_engaged;
  *(undefined7 *)
   &(poVar1->super__Optional_base<unsigned_long,_true,_true>)._M_payload.
    super__Optional_payload_base<unsigned_long>.field_0x9 =
       dst.endpointIndex.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._9_7_;
  expectSemicolon(this);
  std::__cxx11::string::~string((string *)&dst.endpoint);
  std::__cxx11::string::~string((string *)&src.endpoint);
  return;
}

Assistant:

void parseConnection()
    {
        auto& c = module->allocate<heart::Connection> (location);
        module->connections.push_back (c);

        c.interpolationType = parseInterpolationType (*this);
        auto src = readProcessorAndChannel();
        c.source.processor = src.processor;
        c.source.endpointName = src.endpoint;
        c.source.endpointIndex = src.endpointIndex;
        expect (HEARTOperator::rightArrow);

        if (matchIf (HEARTOperator::openBracket))
        {
            c.delayLength = parseInt32();

            expect (HEARTOperator::closeBracket);
            expect (HEARTOperator::rightArrow);
        }

        auto dst = readProcessorAndChannel();
        c.dest.processor = dst.processor;
        c.dest.endpointName = dst.endpoint;
        c.dest.endpointIndex = dst.endpointIndex;

        expectSemicolon();
    }